

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

Promise<void> __thiscall
capnproto_test::capnp::test::TestExtends2::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  undefined6 in_register_00000032;
  Promise<void> PVar1;
  
  PVar1 = ::capnp::Capability::Server::internalUnimplemented
                    ((Server *)this,
                     (char *)((long)CONCAT62(in_register_00000032,methodId) +
                             *(long *)(*(long *)CONCAT62(in_register_00000032,methodId) + -0x18)),
                     0x30dbf4,0x8783);
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestExtends2::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestExtends2",
          0x98d7e0ef61488783ull, methodId);
  }
}